

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O2

void FastPForLib::Simple8b<true>::unpack<7u,8u>(uint32_t **out,uint64_t **in)

{
  ulong uVar1;
  uint *puVar2;
  ulong uVar3;
  
  for (uVar3 = 0x34; uVar3 != 0xfffffffffffffffc; uVar3 = uVar3 - 8) {
    uVar1 = **in;
    puVar2 = *out;
    *out = puVar2 + 1;
    *puVar2 = (uint)(uVar1 >> (uVar3 & 0x3f)) & 0xff;
  }
  *in = *in + 1;
  return;
}

Assistant:

static void unpack(uint32_t *&out, const uint64_t *&in) {
    if (log1 < 32) {
      const uint32_t actuallog1 =
          log1 < 32 ? log1 : 31; // bogus to silence compiler warnings
      const uint32_t mask = ((static_cast<uint32_t>(1) << actuallog1) - 1);
      for (uint32_t k = 0; k < num1; ++k) {
        *(out++) = static_cast<uint32_t>(
                       in[0] >> (64 - SIMPLE8B_LOGDESC - log1 - k * log1)) &
                   mask;
      }
    } else {
      for (uint32_t k = 0; k < num1; ++k) {
        *(out++) = static_cast<uint32_t>(
            in[0] >> (64 - SIMPLE8B_LOGDESC - log1 - k * log1));
      }
    }
    ++in;
  }